

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

size_t readutf16le<MemoryReader*>(MemoryReader *rd,Wstring *v,size_t n)

{
  uint uVar1;
  reference pvVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  size_t __n;
  size_type sVar4;
  size_t nr;
  size_t n_local;
  Wstring *v_local;
  MemoryReader *rd_local;
  
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(v,n);
  pvVar2 = std::__cxx11::
           basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
           ::operator[](v,0);
  uVar1 = (*(rd->super_ReadWriter)._vptr_ReadWriter[2])(rd,pvVar2,n << 1);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "read partial uint16_t";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(v,CONCAT44(extraout_var,uVar1) >> 1);
  pvVar2 = std::__cxx11::
           basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
           ::operator[](v,0);
  __n = stringlength<unsigned_short>(pvVar2);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(v,__n);
  sVar4 = std::__cxx11::
          basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          ::size(v);
  return sVar4;
}

Assistant:

size_t readutf16le(PTR rd, std::Wstring& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n*sizeof(uint16_t));
    if (nr%sizeof(uint16_t))
        throw "read partial uint16_t";
    v.resize(nr/sizeof(uint16_t));
    v.resize(stringlength(&v[0]));
#if __BYTE_ORDER == __BIG_ENDIAN
#ifdef __GXX_EXPERIMENTAL_CXX0X__
    std::for_each(v.begin(), v.end(), [](uint16_t& x) { x= swab16(x);});
#else
    throw "need c++0x";
#endif
#endif

    return v.size();
}